

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int x509_check_wildcard(char *cn,mbedtls_x509_buf *name)

{
  uchar *puVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  
  sVar3 = strlen(cn);
  iVar2 = 0;
  if (((2 < name->len) && (puVar1 = name->p, *puVar1 == '*')) && (iVar2 = 0, puVar1[1] == '.')) {
    iVar2 = -1;
    for (lVar4 = 0; sVar3 - lVar4 != 0; lVar4 = lVar4 + 1) {
      if (cn[lVar4] == '.') {
        if (lVar4 == 0) {
          return -1;
        }
        if ((sVar3 - name->len) + 1 != lVar4) {
          return -1;
        }
        iVar2 = x509_memcasecmp(puVar1 + 1,cn + lVar4,sVar3 - lVar4);
        if (iVar2 != 0) {
          return -1;
        }
        return 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int x509_check_wildcard( const char *cn, mbedtls_x509_buf *name )
{
    size_t i;
    size_t cn_idx = 0, cn_len = strlen( cn );

    if( name->len < 3 || name->p[0] != '*' || name->p[1] != '.' )
        return( 0 );

    for( i = 0; i < cn_len; ++i )
    {
        if( cn[i] == '.' )
        {
            cn_idx = i;
            break;
        }
    }

    if( cn_idx == 0 )
        return( -1 );

    if( cn_len - cn_idx == name->len - 1 &&
        x509_memcasecmp( name->p + 1, cn + cn_idx, name->len - 1 ) == 0 )
    {
        return( 0 );
    }

    return( -1 );
}